

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O2

void handler(int max,int argc,Edge *allEdges)

{
  int iVar1;
  long lVar2;
  Solution *pSVar3;
  char *__format;
  Solution *pSVar4;
  byte bVar5;
  Solution my_solution;
  Solution local_74;
  
  bVar5 = 0;
  do {
    do {
      iVar1 = get_state();
      if (iVar1 < 1) {
        if (iVar1 == 0) {
          return;
        }
        __format = "%s ERROR: couldn\'t fetch program state\n";
        goto LAB_00101490;
      }
      calculate_one_solution(&local_74,argc,allEdges,max);
      pSVar3 = &local_74;
      pSVar4 = &my_solution;
      for (lVar2 = 0x11; lVar2 != 0; lVar2 = lVar2 + -1) {
        *(int *)pSVar4 = pSVar3->edges[0].start;
        pSVar3 = (Solution *)((long)pSVar3 + (ulong)bVar5 * -8 + 4);
        pSVar4 = (Solution *)((long)pSVar4 + ((ulong)bVar5 * -2 + 1) * 4);
      }
    } while (my_solution.amount < 0);
    iVar1 = circ_buf_write(&my_solution);
  } while (iVar1 == 0);
  __format = "%s ERROR: error writing to shared memory\n";
LAB_00101490:
  fprintf(_stderr,__format,name);
  exit(1);
}

Assistant:

static void handler(const int max, const int argc, const Edge *allEdges)
{
	Solution my_solution;

	int state;
	while ((state = get_state()) > 0)
	{

		my_solution = calculate_one_solution(argc, allEdges, max);

		if (my_solution.amount < 0)
		{
#ifdef DEBUG
			fprintf(stdout, "Solution too Big\n");
#endif 
		}
		else
		{
#ifdef DEBUG
			printEdge(my_solution.edges, my_solution.amount);
#endif
			if (circ_buf_write(&my_solution) != 0)
			{
				ERROR_EXIT("error writing to shared memory");
			}
		}
	}
	if (state != 0)
	{
		ERROR_EXIT("couldn't fetch program state");
	}
}